

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_min_a_b_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  
  lVar1 = (ulong)wd * 0x10;
  lVar3 = (ulong)ws * 0x10;
  lVar2 = (ulong)wt * 0x10;
  bVar4 = (byte)(env->active_fpu).fpr[ws].fs[0];
  bVar5 = (byte)(env->active_fpu).fpr[wt].fs[0];
  if ((byte)((bVar4 ^ (char)bVar4 >> 7) - ((char)bVar4 >> 7)) <
      (byte)((bVar5 ^ (char)bVar5 >> 7) - ((char)bVar5 >> 7))) {
    bVar5 = bVar4;
  }
  *(byte *)((env->active_fpu).fpr + wd) = bVar5;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 1);
  bVar4 = *(byte *)((long)(env->active_fpu).fpr + lVar2 + 1);
  if ((byte)((bVar5 ^ (char)bVar5 >> 7) - ((char)bVar5 >> 7)) <
      (byte)((bVar4 ^ (char)bVar4 >> 7) - ((char)bVar4 >> 7))) {
    bVar4 = bVar5;
  }
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 1) = bVar4;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 2);
  bVar4 = *(byte *)((long)(env->active_fpu).fpr + lVar2 + 2);
  if ((byte)((bVar5 ^ (char)bVar5 >> 7) - ((char)bVar5 >> 7)) <
      (byte)((bVar4 ^ (char)bVar4 >> 7) - ((char)bVar4 >> 7))) {
    bVar4 = bVar5;
  }
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 2) = bVar4;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 3);
  bVar4 = *(byte *)((long)(env->active_fpu).fpr + lVar2 + 3);
  if ((byte)((bVar5 ^ (char)bVar5 >> 7) - ((char)bVar5 >> 7)) <
      (byte)((bVar4 ^ (char)bVar4 >> 7) - ((char)bVar4 >> 7))) {
    bVar4 = bVar5;
  }
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 3) = bVar4;
  bVar4 = (byte)*(undefined4 *)((long)(env->active_fpu).fpr + lVar3 + 4);
  bVar5 = (byte)*(undefined4 *)((long)(env->active_fpu).fpr + lVar2 + 4);
  if ((byte)((bVar4 ^ (char)bVar4 >> 7) - ((char)bVar4 >> 7)) <
      (byte)((bVar5 ^ (char)bVar5 >> 7) - ((char)bVar5 >> 7))) {
    bVar5 = bVar4;
  }
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 4) = bVar5;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 5);
  bVar4 = *(byte *)((long)(env->active_fpu).fpr + lVar2 + 5);
  if ((byte)((bVar5 ^ (char)bVar5 >> 7) - ((char)bVar5 >> 7)) <
      (byte)((bVar4 ^ (char)bVar4 >> 7) - ((char)bVar4 >> 7))) {
    bVar4 = bVar5;
  }
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 5) = bVar4;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 6);
  bVar4 = *(byte *)((long)(env->active_fpu).fpr + lVar2 + 6);
  if ((byte)((bVar5 ^ (char)bVar5 >> 7) - ((char)bVar5 >> 7)) <
      (byte)((bVar4 ^ (char)bVar4 >> 7) - ((char)bVar4 >> 7))) {
    bVar4 = bVar5;
  }
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 6) = bVar4;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 7);
  bVar4 = *(byte *)((long)(env->active_fpu).fpr + lVar2 + 7);
  if ((byte)((bVar5 ^ (char)bVar5 >> 7) - ((char)bVar5 >> 7)) <
      (byte)((bVar4 ^ (char)bVar4 >> 7) - ((char)bVar4 >> 7))) {
    bVar4 = bVar5;
  }
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 7) = bVar4;
  bVar4 = (byte)*(undefined4 *)((long)(env->active_fpu).fpr + lVar3 + 8);
  bVar5 = (byte)*(undefined4 *)((long)(env->active_fpu).fpr + lVar2 + 8);
  if ((byte)((bVar4 ^ (char)bVar4 >> 7) - ((char)bVar4 >> 7)) <
      (byte)((bVar5 ^ (char)bVar5 >> 7) - ((char)bVar5 >> 7))) {
    bVar5 = bVar4;
  }
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 8) = bVar5;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 9);
  bVar4 = *(byte *)((long)(env->active_fpu).fpr + lVar2 + 9);
  if ((byte)((bVar5 ^ (char)bVar5 >> 7) - ((char)bVar5 >> 7)) <
      (byte)((bVar4 ^ (char)bVar4 >> 7) - ((char)bVar4 >> 7))) {
    bVar4 = bVar5;
  }
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 9) = bVar4;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 10);
  bVar4 = *(byte *)((long)(env->active_fpu).fpr + lVar2 + 10);
  if ((byte)((bVar5 ^ (char)bVar5 >> 7) - ((char)bVar5 >> 7)) <
      (byte)((bVar4 ^ (char)bVar4 >> 7) - ((char)bVar4 >> 7))) {
    bVar4 = bVar5;
  }
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 10) = bVar4;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xb);
  bVar4 = *(byte *)((long)(env->active_fpu).fpr + lVar2 + 0xb);
  if ((byte)((bVar5 ^ (char)bVar5 >> 7) - ((char)bVar5 >> 7)) <
      (byte)((bVar4 ^ (char)bVar4 >> 7) - ((char)bVar4 >> 7))) {
    bVar4 = bVar5;
  }
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 0xb) = bVar4;
  bVar4 = (byte)*(undefined4 *)((long)(env->active_fpu).fpr + lVar3 + 0xc);
  bVar5 = (byte)*(undefined4 *)((long)(env->active_fpu).fpr + lVar2 + 0xc);
  if ((byte)((bVar4 ^ (char)bVar4 >> 7) - ((char)bVar4 >> 7)) <
      (byte)((bVar5 ^ (char)bVar5 >> 7) - ((char)bVar5 >> 7))) {
    bVar5 = bVar4;
  }
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 0xc) = bVar5;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xd);
  bVar4 = *(byte *)((long)(env->active_fpu).fpr + lVar2 + 0xd);
  if ((byte)((bVar5 ^ (char)bVar5 >> 7) - ((char)bVar5 >> 7)) <
      (byte)((bVar4 ^ (char)bVar4 >> 7) - ((char)bVar4 >> 7))) {
    bVar4 = bVar5;
  }
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 0xd) = bVar4;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xe);
  bVar4 = *(byte *)((long)(env->active_fpu).fpr + lVar2 + 0xe);
  if ((byte)((bVar5 ^ (char)bVar5 >> 7) - ((char)bVar5 >> 7)) <
      (byte)((bVar4 ^ (char)bVar4 >> 7) - ((char)bVar4 >> 7))) {
    bVar4 = bVar5;
  }
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 0xe) = bVar4;
  bVar5 = *(byte *)((long)(env->active_fpu).fpr + lVar3 + 0xf);
  bVar4 = *(byte *)((long)(env->active_fpu).fpr + lVar2 + 0xf);
  if ((byte)((bVar5 ^ (char)bVar5 >> 7) - ((char)bVar5 >> 7)) <
      (byte)((bVar4 ^ (char)bVar4 >> 7) - ((char)bVar4 >> 7))) {
    bVar4 = bVar5;
  }
  *(byte *)((long)(env->active_fpu).fpr + lVar1 + 0xf) = bVar4;
  return;
}

Assistant:

void helper_msa_min_a_b(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->b[0]  = msa_min_a_df(DF_BYTE, pws->b[0],  pwt->b[0]);
    pwd->b[1]  = msa_min_a_df(DF_BYTE, pws->b[1],  pwt->b[1]);
    pwd->b[2]  = msa_min_a_df(DF_BYTE, pws->b[2],  pwt->b[2]);
    pwd->b[3]  = msa_min_a_df(DF_BYTE, pws->b[3],  pwt->b[3]);
    pwd->b[4]  = msa_min_a_df(DF_BYTE, pws->b[4],  pwt->b[4]);
    pwd->b[5]  = msa_min_a_df(DF_BYTE, pws->b[5],  pwt->b[5]);
    pwd->b[6]  = msa_min_a_df(DF_BYTE, pws->b[6],  pwt->b[6]);
    pwd->b[7]  = msa_min_a_df(DF_BYTE, pws->b[7],  pwt->b[7]);
    pwd->b[8]  = msa_min_a_df(DF_BYTE, pws->b[8],  pwt->b[8]);
    pwd->b[9]  = msa_min_a_df(DF_BYTE, pws->b[9],  pwt->b[9]);
    pwd->b[10] = msa_min_a_df(DF_BYTE, pws->b[10], pwt->b[10]);
    pwd->b[11] = msa_min_a_df(DF_BYTE, pws->b[11], pwt->b[11]);
    pwd->b[12] = msa_min_a_df(DF_BYTE, pws->b[12], pwt->b[12]);
    pwd->b[13] = msa_min_a_df(DF_BYTE, pws->b[13], pwt->b[13]);
    pwd->b[14] = msa_min_a_df(DF_BYTE, pws->b[14], pwt->b[14]);
    pwd->b[15] = msa_min_a_df(DF_BYTE, pws->b[15], pwt->b[15]);
}